

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KktCheck.cpp
# Opt level: O0

void __thiscall
KktCheck::setIndexVectors
          (KktCheck *this,vector<int,_std::allocator<int>_> *rIndex,
          vector<int,_std::allocator<int>_> *cIndex)

{
  size_type sVar1;
  reference pvVar2;
  vector<int,_std::allocator<int>_> *pvVar3;
  vector<int,_std::allocator<int>_> *in_RDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  size_t i_1;
  size_t i;
  value_type *in_stack_ffffffffffffffa8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffb0;
  vector<int,_std::allocator<int>_> *this_00;
  vector<int,_std::allocator<int>_> *local_30;
  ulong local_20;
  
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x1bfb69);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x1bfb7a);
  local_20 = 0;
  while( true ) {
    sVar1 = std::vector<int,_std::allocator<int>_>::size(in_RSI);
    if (sVar1 <= local_20) break;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,local_20);
    if (*pvVar2 != -1) {
      std::vector<int,_std::allocator<int>_>::push_back
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    }
    local_20 = local_20 + 1;
  }
  local_30 = (vector<int,_std::allocator<int>_> *)0x0;
  while( true ) {
    this_00 = local_30;
    pvVar3 = (vector<int,_std::allocator<int>_> *)
             std::vector<int,_std::allocator<int>_>::size(in_RDX);
    if (pvVar3 <= this_00) break;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(size_type)local_30);
    if (*pvVar2 != -1) {
      std::vector<int,_std::allocator<int>_>::push_back(this_00,in_stack_ffffffffffffffa8);
    }
    local_30 = (vector<int,_std::allocator<int>_> *)
               ((long)&(local_30->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start + 1);
  }
  return;
}

Assistant:

void KktCheck::setIndexVectors(vector<int>& rIndex, vector<int>& cIndex){
	rIndexRev.clear();
	cIndexRev.clear();

	for (size_t i=0;i<rIndex.size(); i++) {
		if (rIndex[i] != -1) {
			rIndexRev.push_back(i);
		}
	}
	for (size_t i=0;i<cIndex.size(); i++) {
		if (cIndex[i] != -1) {
			cIndexRev.push_back(i);
		}
	}

}